

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

string * jsonnet::internal::strip_ws(string *s,uint margin)

{
  bool bVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  char *pcVar4;
  allocator<char> *__a;
  uint in_EDX;
  string *in_RSI;
  string *in_RDI;
  bool bVar5;
  size_t j;
  size_t i;
  allocator<char> *__end;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  allocator<char> local_29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  uint local_14;
  string *local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  lVar2 = std::__cxx11::string::size();
  if (lVar2 == 0) {
    std::__cxx11::string::string((string *)in_RDI,local_10);
  }
  else {
    local_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    while( true ) {
      this = local_20;
      pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::__cxx11::string::length();
      bVar5 = false;
      if (this < pbVar3) {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_10);
        bVar1 = is_horz_ws(*pcVar4);
        bVar5 = false;
        if (bVar1) {
          bVar5 = local_20 <
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (ulong)local_14;
        }
      }
      if (!bVar5) break;
      local_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &local_20->field_0x1;
    }
    local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::__cxx11::string::size();
    while( true ) {
      uVar6 = false;
      if (local_20 < local_28) {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_10);
        uVar6 = is_horz_ws(*pcVar4);
      }
      if ((bool)uVar6 == false) break;
      local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&local_28[-1].field_2 + 0xf);
    }
    std::__cxx11::string::operator[]((ulong)local_10);
    __a = (allocator<char> *)std::__cxx11::string::operator[]((ulong)local_10);
    __end = &local_29;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>
              (this,(char *)CONCAT17(uVar6,in_stack_ffffffffffffff98),(char *)__end,__a);
    std::allocator<char>::~allocator(&local_29);
  }
  return in_RDI;
}

Assistant:

static std::string strip_ws(const std::string &s, unsigned margin)
{
    if (s.size() == 0)
        return s;  // Avoid underflow below.
    size_t i = 0;
    while (i < s.length() && is_horz_ws(s[i]) && i < margin)
        i++;
    size_t j = s.size();
    while (j > i && is_horz_ws(s[j - 1])) {
        j--;
    }
    return std::string(&s[i], &s[j]);
}